

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MhsWriter.cpp
# Opt level: O0

void __thiscall adios2::core::engine::MhsWriter::~MhsWriter(MhsWriter *this)

{
  MhsWriter *in_RDI;
  int i;
  ADIOS *in_stack_ffffffffffffff98;
  ADIOS *in_stack_ffffffffffffffa0;
  vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_> *in_stack_ffffffffffffffb0
  ;
  string local_30 [28];
  int in_stack_ffffffffffffffec;
  int local_c;
  
  (in_RDI->super_Engine)._vptr_Engine = (_func_int **)&PTR__MhsWriter_01137928;
  for (local_c = 0; local_c < in_RDI->m_Tiers; local_c = local_c + 1) {
    in_stack_ffffffffffffffa0 = ((in_RDI->super_Engine).m_IO)->m_ADIOS;
    std::__cxx11::to_string(in_stack_ffffffffffffffec);
    std::operator+((char *)in_RDI,&in_stack_ffffffffffffffa0->m_HostLanguage);
    ADIOS::RemoveIO(in_stack_ffffffffffffff98,(string *)0xe63082);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  if (((in_RDI->super_Engine).m_IsOpen & 1U) != 0) {
    DestructorClose(in_RDI,(bool)((in_RDI->super_Engine).m_FailVerbose & 1));
  }
  (in_RDI->super_Engine).m_IsOpen = false;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Operator>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Operator>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Operator>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Operator>_>_>_>
                    *)0xe630e0);
  std::vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>::~vector
            (in_stack_ffffffffffffffb0);
  std::vector<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>::~vector
            ((vector<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_> *)
             in_stack_ffffffffffffffb0);
  Engine::~Engine((Engine *)in_stack_ffffffffffffffa0);
  return;
}

Assistant:

MhsWriter::~MhsWriter()
{
    for (int i = 0; i < m_Tiers; ++i)
    {
        m_IO.m_ADIOS.RemoveIO("SubIO" + std::to_string(i));
    }
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}